

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual.c
# Opt level: O0

void dill_assoc_client_data(dill_exec_ctx ec,int key,long value)

{
  void *pvVar1;
  undefined8 in_RDX;
  int in_ESI;
  long in_RDI;
  int i;
  size_t in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  int iVar2;
  
  iVar2 = 0;
  while( true ) {
    if (*(int *)(in_RDI + 0x30) <= iVar2) {
      if (*(int *)(in_RDI + 0x30) == 0) {
        pvVar1 = dill_malloc(CONCAT44(iVar2,in_stack_ffffffffffffffe0));
        *(void **)(in_RDI + 0x38) = pvVar1;
      }
      else {
        pvVar1 = dill_realloc((void *)CONCAT44(iVar2,in_stack_ffffffffffffffe0),
                              in_stack_ffffffffffffffd8);
        *(void **)(in_RDI + 0x38) = pvVar1;
      }
      *(int *)(*(long *)(in_RDI + 0x38) + (long)*(int *)(in_RDI + 0x30) * 0x10) = in_ESI;
      iVar2 = *(int *)(in_RDI + 0x30);
      *(int *)(in_RDI + 0x30) = iVar2 + 1;
      *(undefined8 *)(*(long *)(in_RDI + 0x38) + (long)iVar2 * 0x10 + 8) = in_RDX;
      return;
    }
    if (*(int *)(*(long *)(in_RDI + 0x38) + (long)iVar2 * 0x10) == in_ESI) break;
    iVar2 = iVar2 + 1;
  }
  *(undefined8 *)(*(long *)(in_RDI + 0x38) + (long)iVar2 * 0x10 + 8) = in_RDX;
  return;
}

Assistant:

extern void
dill_assoc_client_data(dill_exec_ctx ec, int key, IMM_TYPE value)
{
    int i = 0;
    for (i = 0; i < ec->client_data_count; i++) {
        if (ec->client_data[i].key == key) {
            ec->client_data[i].value = value;
            return;
        }
    }
    if (ec->client_data_count == 0) {
        ec->client_data = malloc(sizeof(struct client_data_struct));
    } else {
        ec->client_data =
            realloc(ec->client_data, sizeof(struct client_data_struct) *
                                         (ec->client_data_count + 1));
    }
    ec->client_data[ec->client_data_count].key = key;
    ec->client_data[ec->client_data_count++].value = value;
}